

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_reflect_has(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSAtom prop;
  int iVar1;
  JSValueUnion JVar2;
  int64_t iVar3;
  JSValue obj;
  JSValue JVar4;
  
  iVar3 = argv->tag;
  if ((int)iVar3 == -1) {
    JVar2 = (JSValueUnion)(argv->u).ptr;
    prop = JS_ValueToAtom(ctx,argv[1]);
    if (prop != 0) {
      obj.tag = iVar3;
      obj.u = (JSValueUnion)(JSValueUnion)JVar2.ptr;
      iVar1 = JS_HasProperty(ctx,obj,prop);
      JS_FreeAtom(ctx,prop);
      if (-1 < iVar1) {
        JVar2._1_7_ = 0;
        JVar2.int32._0_1_ = iVar1 != 0;
        iVar3 = 1;
        goto LAB_00159c55;
      }
    }
  }
  else {
    JS_ThrowTypeErrorNotAnObject(ctx);
  }
  iVar3 = 6;
  JVar2.float64 = 0.0;
LAB_00159c55:
  JVar4.tag = iVar3;
  JVar4.u.float64 = JVar2.float64;
  return JVar4;
}

Assistant:

static JSValue js_reflect_has(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    JSValueConst obj, prop;
    JSAtom atom;
    int ret;

    obj = argv[0];
    prop = argv[1];
    if (JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT)
        return JS_ThrowTypeErrorNotAnObject(ctx);
    atom = JS_ValueToAtom(ctx, prop);
    if (unlikely(atom == JS_ATOM_NULL))
        return JS_EXCEPTION;
    ret = JS_HasProperty(ctx, obj, atom);
    JS_FreeAtom(ctx, atom);
    if (ret < 0)
        return JS_EXCEPTION;
    else
        return JS_NewBool(ctx, ret);
}